

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O0

string * __thiscall pbrt::MLTSampler::ToString_abi_cxx11_(MLTSampler *this)

{
  int *unaff_RBX;
  string *in_RDI;
  float *unaff_R14;
  float *unaff_R15;
  RNG *unaff_retaddr;
  char *in_stack_00000008;
  long *in_stack_00000048;
  bool *in_stack_00000050;
  long *in_stack_00000058;
  int *in_stack_00000060;
  int *in_stack_00000068;
  
  StringPrintf<pbrt::RNG_const&,float_const&,float_const&,int_const&,pstd::vector<pbrt::MLTSampler::PrimarySample,pstd::pmr::polymorphic_allocator<pbrt::MLTSampler::PrimarySample>>const&,long_const&,bool_const&,long_const&,int_const&,int_const&>
            (in_stack_00000008,unaff_retaddr,unaff_R15,unaff_R14,unaff_RBX,
             (vector<pbrt::MLTSampler::PrimarySample,_pstd::pmr::polymorphic_allocator<pbrt::MLTSampler::PrimarySample>_>
              *)this,in_stack_00000048,in_stack_00000050,in_stack_00000058,in_stack_00000060,
             in_stack_00000068);
  return in_RDI;
}

Assistant:

std::string ToString() const {
        return StringPrintf(
            "[ MLTSampler rng: %s sigma: %f largeStepProbability: %f "
            "streamCount: %d X: %s currentIteration: %d largeStep: %s "
            "lastLargeStepIteration: %d streamIndex: %d sampleIndex: %d ] ",
            rng, sigma, largeStepProbability, streamCount, X, currentIteration, largeStep,
            lastLargeStepIteration, streamIndex, sampleIndex);
    }